

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImage.hpp
# Opt level: O3

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::NIB>::DiskImageHolder<std::__cxx11::string_const&>
          (DiskImageHolder<Storage::Disk::NIB> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_DiskImageHolderBase).unwritten_tracks_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var1 = &(this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_DiskImageHolderBase).cached_tracks_._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  (this->super_DiskImageHolderBase).update_queue_._M_t.
  super___uniq_ptr_impl<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
  .super__Head_base<0UL,_Concurrency::AsyncTaskQueue<true,_true,_void>_*,_false>._M_head_impl =
       (AsyncTaskQueue<true,_true,_void> *)0x0;
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_0058f738;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_0058f798;
  NIB::NIB(&this->disk_image_,args);
  return;
}

Assistant:

DiskImageHolder(Ts&&... args) :
			disk_image_(args...) {}